

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week5-app1.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  Vector<int> v_int;
  Vector<Date> v;
  Date d3;
  Date d2;
  Date d1;
  Vector<int> local_60;
  Vector<Date> local_50;
  Date local_3c;
  Date local_30;
  Date local_24;
  
  local_24.year = 0x7dc;
  local_24.month = 0;
  local_24.day = 0;
  local_30.year = 0x7e4;
  local_30.month = 7;
  local_30.day = 0;
  local_3c.year = 0x7e4;
  local_3c.month = 10;
  local_3c.day = 0x1e;
  print(&local_24);
  print(&local_30);
  print(&local_3c);
  local_50.N = 3;
  local_50.values = (Date *)operator_new__(0x24);
  (local_50.values)->year = 0;
  (local_50.values)->month = 0;
  *(undefined8 *)&(local_50.values)->day = 0;
  local_50.values[1].month = 0;
  local_50.values[1].day = 0;
  local_50.values[2].year = 0;
  local_50.values[2].month = 0;
  local_50.values[2].day = 0;
  local_50.values[2].day = 0;
  local_50.values[1].month = 0;
  local_50.values[1].day = 0;
  local_50.values[2].year = 0;
  local_50.values[2].month = 0;
  (local_50.values)->year = 0;
  (local_50.values)->month = 0;
  *(undefined8 *)&(local_50.values)->day = 0;
  print<Date>(&local_50);
  (local_50.values)->day = local_24.day;
  (local_50.values)->year = local_24.year;
  (local_50.values)->month = local_24.month;
  local_50.values[1].day = local_30.day;
  local_50.values[1].year = local_30.year;
  local_50.values[1].month = local_30.month;
  local_50.values[2].day = local_3c.day;
  local_50.values[2].year = local_3c.year;
  local_50.values[2].month = local_3c.month;
  print<Date>(&local_50);
  local_60.N = 3;
  local_60.values = (int *)operator_new__(0xc);
  local_60.values[2] = 0;
  local_60.values[0] = 0;
  local_60.values[1] = 0;
  lVar2 = 0;
  do {
    lVar1 = lVar2 + 1;
    local_60.values[lVar2] = (int)lVar1;
    lVar2 = lVar1;
  } while (lVar1 != 3);
  print<int>(&local_60);
  if (local_60.values != (int *)0x0) {
    operator_delete__(local_60.values);
  }
  if (local_50.values != (Date *)0x0) {
    operator_delete__(local_50.values);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    auto d1 = Date(2012);
    auto d2 = Date(2020, 7);
    auto d3 = Date(2020, 10, 30);
    print(d1);
    print(d2);
    print(d3);

    auto v = Vector<Date>(3);
    print(v);
    v.set(0, d1);
    v.set(1, d2);
    v.set(2, d3);
    print(v);

    auto v_int = Vector<int>(3);
    for(int i=0; i<3; ++i)
        v_int.set(i, i+1);
    print(v_int);

    return 0;
}